

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  char cVar2;
  undefined8 *puVar3;
  ulong uVar4;
  char *pcVar5;
  
  pCVar1 = conn->data;
  puVar3 = (undefined8 *)(*Curl_ccalloc)(0x20,1);
  (conn->data->req).protop = puVar3;
  if (puVar3 != (undefined8 *)0x0) {
    pcVar5 = (pCVar1->state).up.path + 1;
    *puVar3 = pcVar5;
    pcVar5 = strstr(pcVar5,";type=");
    if ((pcVar5 != (char *)0x0) ||
       (pcVar5 = strstr((conn->host).rawalloc,";type="), pcVar5 != (char *)0x0)) {
      *pcVar5 = '\0';
      cVar2 = Curl_raw_toupper(pcVar5[6]);
      uVar4 = *(ulong *)&(pCVar1->set).field_0x978;
      if (cVar2 == 'D') {
        uVar4 = uVar4 | 0x2000;
      }
      else if (cVar2 == 'A') {
        uVar4 = uVar4 | 0x800;
      }
      else {
        uVar4 = uVar4 & 0xfffffffffffff7ff;
      }
      *(ulong *)&(pCVar1->set).field_0x978 = uVar4;
    }
    *(undefined4 *)(puVar3 + 2) = 0;
    puVar3[3] = 0;
    (conn->proto).ftpc.known_filesize = -1;
    return CURLE_OK;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

static CURLcode ftp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  char *type;
  struct FTP *ftp;

  conn->data->req.protop = ftp = calloc(sizeof(struct FTP), 1);
  if(NULL == ftp)
    return CURLE_OUT_OF_MEMORY;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->set.ftp_list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = FTPTRANSFER_BODY;
  ftp->downloadsize = 0;
  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}